

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix(SquareMatrix<float> *this,int64_t size,float value)

{
  this->size_ = size;
  init_unique_array<float>((dense *)&this->data_,size * size,value);
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<float>::SquareMatrix(const int64_t, const T) [T = float]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }